

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall cmTargetTraceDependencies::Trace(cmTargetTraceDependencies *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  cmSourceFile *this_00;
  pointer pbVar3;
  pointer pbVar4;
  bool bVar5;
  _Elt_pointer ppcVar6;
  mapped_type *pmVar7;
  char *__s;
  size_t sVar8;
  string *psVar9;
  cmCustomCommand *cc;
  string *objDep;
  pointer in_name;
  cmSourceFile *sf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objDeps;
  cmSourceFile *local_70;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  ppcVar6 = (this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->SourceQueue).c.super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_cur != ppcVar6) {
    paVar1 = &local_68.field_2;
    do {
      local_70 = *ppcVar6;
      std::deque<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::pop_front(&(this->SourceQueue).c)
      ;
      pmVar7 = std::
               map<const_cmSourceFile_*,_cmGeneratorTarget::SourceEntry,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceEntry>_>_>
               ::operator[](&this->GeneratorTarget->SourceDepends,&local_70);
      this_00 = local_70;
      this->CurrentEntry = pmVar7;
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"OBJECT_DEPENDS","");
      __s = cmSourceFile::GetProperty(this_00,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if (__s != (char *)0x0) {
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_68._M_dataplus._M_p = (pointer)paVar1;
        sVar8 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,__s,__s + sVar8);
        cmSystemTools::ExpandListArgument(&local_68,&local_48,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != paVar1) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        pbVar3 = local_48.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        in_name = local_48.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            bVar5 = cmsys::SystemTools::FileIsFullPath(in_name);
            if (bVar5) {
              cmsys::SystemTools::CollapseFullPath(&local_68,in_name);
              std::__cxx11::string::operator=((string *)in_name,(string *)&local_68);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_dataplus._M_p != paVar1) {
                operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1
                               );
              }
            }
            pbVar4 = local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            in_name = in_name + 1;
            psVar9 = local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          } while (in_name != pbVar3);
          for (; psVar9 != pbVar4; psVar9 = psVar9 + 1) {
            FollowName(this,psVar9);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_48);
      }
      psVar9 = cmSourceFile::GetFullPath(local_70,(string *)0x0);
      FollowName(this,psVar9);
      psVar2 = (local_70->Depends).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar9 = (local_70->Depends).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; psVar9 != psVar2; psVar9 = psVar9 + 1
          ) {
        FollowName(this,psVar9);
      }
      cc = cmSourceFile::GetCustomCommand(local_70);
      if (cc != (cmCustomCommand *)0x0) {
        CheckCustomCommand(this,cc);
      }
      ppcVar6 = (this->SourceQueue).c.
                super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur;
    } while ((this->SourceQueue).c.
             super__Deque_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur != ppcVar6);
  }
  this->CurrentEntry = (SourceEntry *)0x0;
  cmGeneratorTarget::AddTracedSources(this->GeneratorTarget,&this->NewSources);
  return;
}

Assistant:

void cmTargetTraceDependencies::Trace()
{
  // Process one dependency at a time until the queue is empty.
  while (!this->SourceQueue.empty()) {
    // Get the next source from the queue.
    cmSourceFile* sf = this->SourceQueue.front();
    this->SourceQueue.pop();
    this->CurrentEntry = &this->GeneratorTarget->SourceDepends[sf];

    // Queue dependencies added explicitly by the user.
    if (const char* additionalDeps = sf->GetProperty("OBJECT_DEPENDS")) {
      std::vector<std::string> objDeps;
      cmSystemTools::ExpandListArgument(additionalDeps, objDeps);
      for (std::string& objDep : objDeps) {
        if (cmSystemTools::FileIsFullPath(objDep)) {
          objDep = cmSystemTools::CollapseFullPath(objDep);
        }
      }
      this->FollowNames(objDeps);
    }

    // Queue the source needed to generate this file, if any.
    this->FollowName(sf->GetFullPath());

    // Queue dependencies added programmatically by commands.
    this->FollowNames(sf->GetDepends());

    // Queue custom command dependencies.
    if (cmCustomCommand const* cc = sf->GetCustomCommand()) {
      this->CheckCustomCommand(*cc);
    }
  }
  this->CurrentEntry = nullptr;

  this->GeneratorTarget->AddTracedSources(this->NewSources);
}